

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

bool __thiscall Container::is_memory_limit_hit(Container *this)

{
  CgroupController *pCVar1;
  longlong lVar2;
  size_t in_RCX;
  allocator<char> local_49;
  string local_48 [32];
  string data;
  
  pCVar1 = this->memory_controller_;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"memory.failcnt",&local_49);
  CgroupController::read((CgroupController *)&data,(int)pCVar1,local_48,in_RCX);
  std::__cxx11::string::~string(local_48);
  lVar2 = std::__cxx11::stoll(&data,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&data);
  return lVar2 != 0;
}

Assistant:

bool Container::is_memory_limit_hit() {
    std::string data = memory_controller_->read("memory.failcnt");
    return stoll(data);
}